

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,size_t other)

{
  undefined8 extraout_RAX;
  undefined8 uVar1;
  RangeValue RVar2;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (this->_isUnbound == true) {
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_20._isUnbound);
  }
  else {
    uVar1 = 0;
    local_20._val = 0;
    if (other <= this->_val) {
      local_20._val = this->_val - other;
    }
  }
  RVar2._val = local_20._val;
  RVar2._0_8_ = uVar1;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator- (size_t other) const {
    RangeValue retval;
    if (_isUnbound)
        return retval;
    else {
        if (other > _val)
            retval.set(0);
        else
            retval.set(_val - other);
        return retval;
    }
}